

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t terminal_telltc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t wVar1;
  char **ppcVar2;
  wchar_t *pwVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  fwrite("\n\tYour terminal has the\n",0x18,1,(FILE *)el->el_outfile);
  fwrite("\tfollowing characteristics:\n\n",0x1d,1,(FILE *)el->el_outfile);
  pwVar3 = (el->el_terminal).t_val;
  fprintf((FILE *)el->el_outfile,"\tIt has %d columns and %d lines\n",(ulong)(uint)pwVar3[3],
          (ulong)(uint)pwVar3[2]);
  pcVar4 = "a";
  if (((el->el_terminal).t_flags & L'@') == L'\0') {
    pcVar4 = "no";
  }
  fprintf((FILE *)el->el_outfile,"\tIt has %s meta key\n",pcVar4);
  pcVar4 = " ";
  if (((el->el_terminal).t_flags & L'\b') == L'\0') {
    pcVar4 = "not ";
  }
  fprintf((FILE *)el->el_outfile,"\tIt can%suse tabs\n",pcVar4);
  pcVar7 = "has";
  pcVar4 = "has";
  if (-1 < (char)(el->el_terminal).t_flags) {
    pcVar4 = "does not have";
  }
  fprintf((FILE *)el->el_outfile,"\tIt %s automatic margins\n",pcVar4);
  wVar1 = (el->el_terminal).t_flags;
  if ((char)wVar1 < '\0') {
    if (((uint)wVar1 >> 8 & 1) == 0) {
      pcVar7 = "does not have";
    }
    fprintf((FILE *)el->el_outfile,"\tIt %s magic margins\n",pcVar7);
  }
  ppcVar2 = (el->el_terminal).t_str;
  lVar5 = 0;
  pcVar4 = "al";
  do {
    pcVar7 = *(char **)((long)ppcVar2 + lVar5);
    pcVar6 = "(empty)";
    if ((pcVar7 != (char *)0x0) && (pcVar6 = "(empty)", *pcVar7 != '\0')) {
      pwVar3 = ct_decode_string(pcVar7,&el->el_scratch);
      pwVar3 = ct_visual_string(pwVar3,&el->el_visual);
      pcVar6 = ct_encode_string(pwVar3,&el->el_scratch);
    }
    pcVar7 = *(char **)((long)&tstr[1].name + lVar5 * 2);
    fprintf((FILE *)el->el_outfile,"\t%25s (%s) == %s\n",
            *(undefined8 *)((long)&tstr[0].long_name + lVar5 * 2),pcVar4,pcVar6);
    lVar5 = lVar5 + 8;
    pcVar4 = pcVar7;
  } while (pcVar7 != (char *)0x0);
  fputc(10,(FILE *)el->el_outfile);
  return L'\0';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_telltc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv __attribute__((__unused__)))
{
	const struct termcapstr *t;
	char **ts;

	(void) fprintf(el->el_outfile, "\n\tYour terminal has the\n");
	(void) fprintf(el->el_outfile, "\tfollowing characteristics:\n\n");
	(void) fprintf(el->el_outfile, "\tIt has %d columns and %d lines\n",
	    Val(T_co), Val(T_li));
	(void) fprintf(el->el_outfile,
	    "\tIt has %s meta key\n", EL_HAS_META ? "a" : "no");
	(void) fprintf(el->el_outfile,
	    "\tIt can%suse tabs\n", EL_CAN_TAB ? " " : "not ");
	(void) fprintf(el->el_outfile, "\tIt %s automatic margins\n",
	    EL_HAS_AUTO_MARGINS ? "has" : "does not have");
	if (EL_HAS_AUTO_MARGINS)
		(void) fprintf(el->el_outfile, "\tIt %s magic margins\n",
		    EL_HAS_MAGIC_MARGINS ? "has" : "does not have");

	for (t = tstr, ts = el->el_terminal.t_str; t->name != NULL; t++, ts++) {
		const char *ub;
		if (*ts && **ts) {
			ub = ct_encode_string(ct_visual_string(
			    ct_decode_string(*ts, &el->el_scratch),
			    &el->el_visual), &el->el_scratch);
		} else {
			ub = "(empty)";
		}
		(void) fprintf(el->el_outfile, "\t%25s (%s) == %s\n",
		    t->long_name, t->name, ub);
	}
	(void) fputc('\n', el->el_outfile);
	return 0;
}